

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O2

bool __thiscall
google::protobuf::TextFormat::Printer::PrintAny
          (Printer *this,Message *message,BaseTextGenerator *generator)

{
  Finder *pFVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  Descriptor *type;
  Message *this_00;
  MessageLite *this_01;
  FastFieldValuePrinter *pFVar4;
  LogMessage *pLVar5;
  string *in_R8;
  Metadata MVar6;
  string_view type_url;
  string_view data;
  FieldDescriptor *value_field;
  LogMessage local_108 [16];
  FieldDescriptor *type_url_field;
  string local_f0;
  string full_type_name;
  string url_prefix;
  string serialized_value;
  DynamicMessageFactory factory;
  
  bVar2 = internal::GetAnyFieldDescriptors(message,&type_url_field,&value_field);
  if (!bVar2) {
    return false;
  }
  MVar6 = Message::GetMetadata(message);
  Reflection::GetString_abi_cxx11_(&local_f0,MVar6.reflection,message,type_url_field);
  url_prefix._M_dataplus._M_p = (pointer)&url_prefix.field_2;
  url_prefix._M_string_length = 0;
  full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
  full_type_name._M_string_length = 0;
  url_prefix.field_2._M_local_buf[0] = '\0';
  full_type_name.field_2._M_local_buf[0] = '\0';
  type_url._M_str = (char *)&url_prefix;
  type_url._M_len = (size_t)local_f0._M_dataplus._M_p;
  bVar2 = internal::ParseAnyTypeUrl
                    ((internal *)local_f0._M_string_length,type_url,&full_type_name,in_R8);
  if (bVar2) {
    pFVar1 = this->finder_;
    if (pFVar1 == (Finder *)0x0) {
      type = anon_unknown_1::DefaultFinderFindAnyType(message,&url_prefix,&full_type_name);
    }
    else {
      iVar3 = (*pFVar1->_vptr_Finder[4])(pFVar1,message,&url_prefix,&full_type_name);
      type = (Descriptor *)CONCAT44(extraout_var,iVar3);
    }
    if (type != (Descriptor *)0x0) {
      DynamicMessageFactory::DynamicMessageFactory(&factory);
      this_00 = DynamicMessageFactory::GetPrototype(&factory,type);
      this_01 = &Message::New(this_00)->super_MessageLite;
      Reflection::GetString_abi_cxx11_(&serialized_value,MVar6.reflection,message,value_field);
      data._M_str = serialized_value._M_dataplus._M_p;
      data._M_len = serialized_value._M_string_length;
      bVar2 = MessageLite::ParseFromString(this_01,data);
      if (bVar2) {
        (*generator->_vptr_BaseTextGenerator[5])(generator,"[",1);
        (*generator->_vptr_BaseTextGenerator[5])
                  (generator,local_f0._M_dataplus._M_p,local_f0._M_string_length);
        (*generator->_vptr_BaseTextGenerator[5])(generator,"]",1);
        pFVar4 = GetFieldPrinter(this,value_field);
        (*pFVar4->_vptr_FastFieldValuePrinter[0xe])
                  (pFVar4,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
        (*generator->_vptr_BaseTextGenerator[2])(generator);
        Print(this,(Message *)this_01,generator);
        (*generator->_vptr_BaseTextGenerator[3])(generator);
        (*pFVar4->_vptr_FastFieldValuePrinter[0x10])
                  (pFVar4,message,0xffffffffffffffff,0,(ulong)this->single_line_mode_,generator);
      }
      else {
        absl::lts_20240722::log_internal::LogMessage::LogMessage
                  (local_108,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0x945);
        pLVar5 = (LogMessage *)
                 absl::lts_20240722::log_internal::LogMessage::operator<<
                           (local_108,(string *)&local_f0);
        absl::lts_20240722::log_internal::LogMessage::operator<<
                  (pLVar5,(char (*) [27])": failed to parse contents");
        absl::lts_20240722::log_internal::LogMessage::~LogMessage(local_108);
      }
      std::__cxx11::string::~string((string *)&serialized_value);
      (*this_01->_vptr_MessageLite[1])(this_01);
      DynamicMessageFactory::~DynamicMessageFactory(&factory);
      goto LAB_002c5871;
    }
    absl::lts_20240722::log_internal::LogMessage::LogMessage
              ((LogMessage *)&factory,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/text_format.cc"
               ,0x93c);
    pLVar5 = absl::lts_20240722::log_internal::LogMessage::operator<<
                       ((LogMessage *)&factory,
                        (char (*) [39])"Can\'t print proto content: proto type ");
    pLVar5 = (LogMessage *)
             absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar5,(string *)&local_f0);
    absl::lts_20240722::log_internal::LogMessage::operator<<(pLVar5,(char (*) [11])" not found");
    absl::lts_20240722::log_internal::LogMessage::~LogMessage((LogMessage *)&factory);
  }
  bVar2 = false;
LAB_002c5871:
  std::__cxx11::string::~string((string *)&full_type_name);
  std::__cxx11::string::~string((string *)&url_prefix);
  std::__cxx11::string::~string((string *)&local_f0);
  return bVar2;
}

Assistant:

bool TextFormat::Printer::PrintAny(const Message& message,
                                   BaseTextGenerator* generator) const {
  const FieldDescriptor* type_url_field;
  const FieldDescriptor* value_field;
  if (!internal::GetAnyFieldDescriptors(message, &type_url_field,
                                        &value_field)) {
    return false;
  }

  const Reflection* reflection = message.GetReflection();

  // Extract the full type name from the type_url field.
  const std::string& type_url = reflection->GetString(message, type_url_field);
  std::string url_prefix;
  std::string full_type_name;

  if (!internal::ParseAnyTypeUrl(type_url, &url_prefix, &full_type_name)) {
    return false;
  }

  // Print the "value" in text.
  const Descriptor* value_descriptor =
      finder_ ? finder_->FindAnyType(message, url_prefix, full_type_name)
              : DefaultFinderFindAnyType(message, url_prefix, full_type_name);
  if (value_descriptor == nullptr) {
    ABSL_LOG(WARNING) << "Can't print proto content: proto type " << type_url
                      << " not found";
    return false;
  }
  DynamicMessageFactory factory;
  std::unique_ptr<Message> value_message(
      factory.GetPrototype(value_descriptor)->New());
  std::string serialized_value = reflection->GetString(message, value_field);
  if (!value_message->ParseFromString(serialized_value)) {
    ABSL_LOG(WARNING) << type_url << ": failed to parse contents";
    return false;
  }
  generator->PrintLiteral("[");
  generator->PrintString(type_url);
  generator->PrintLiteral("]");
  const FastFieldValuePrinter* printer = GetFieldPrinter(value_field);
  printer->PrintMessageStart(message, -1, 0, single_line_mode_, generator);
  generator->Indent();
  Print(*value_message, generator);
  generator->Outdent();
  printer->PrintMessageEnd(message, -1, 0, single_line_mode_, generator);
  return true;
}